

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

GLMRegressor * __thiscall CoreML::Specification::Model::mutable_glmregressor(Model *this)

{
  bool bVar1;
  GLMRegressor *this_00;
  Model *this_local;
  
  bVar1 = has_glmregressor(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_glmregressor(this);
    this_00 = (GLMRegressor *)operator_new(0x48);
    GLMRegressor::GLMRegressor(this_00);
    (this->Type_).glmregressor_ = this_00;
  }
  return (GLMRegressor *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::GLMRegressor* Model::mutable_glmregressor() {
  if (!has_glmregressor()) {
    clear_Type();
    set_has_glmregressor();
    Type_.glmregressor_ = new ::CoreML::Specification::GLMRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.glmRegressor)
  return Type_.glmregressor_;
}